

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O0

void __thiscall
miniros::Publisher::Publisher
          (Publisher *this,string *topic,string *md5sum,string *datatype,NodeHandle *node_handle,
          SubscriberCallbacksPtr *callbacks)

{
  element_type *peVar1;
  string *in_RCX;
  string *in_RDX;
  NodeHandle *in_RSI;
  shared_ptr<miniros::SubscriberCallbacks> *in_R9;
  shared_ptr<miniros::NodeHandle> *in_stack_ffffffffffffff78;
  shared_ptr<miniros::NodeHandle> *in_stack_ffffffffffffff80;
  
  std::make_shared<miniros::Publisher::Impl>();
  peVar1 = std::
           __shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x492546);
  std::__cxx11::string::operator=((string *)peVar1,(string *)in_RSI);
  peVar1 = std::
           __shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x492569);
  std::__cxx11::string::operator=((string *)&peVar1->md5sum_,in_RDX);
  peVar1 = std::
           __shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x492590);
  std::__cxx11::string::operator=((string *)&peVar1->datatype_,in_RCX);
  std::make_shared<miniros::NodeHandle,miniros::NodeHandle_const&>(in_RSI);
  std::__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4925be);
  std::shared_ptr<miniros::NodeHandle>::operator=
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::shared_ptr<miniros::NodeHandle>::~shared_ptr((shared_ptr<miniros::NodeHandle> *)0x4925d9);
  std::__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4925ed);
  std::shared_ptr<miniros::SubscriberCallbacks>::operator=
            (in_R9,(shared_ptr<miniros::SubscriberCallbacks> *)in_stack_ffffffffffffff78);
  return;
}

Assistant:

Publisher::Publisher(const std::string& topic, const std::string& md5sum, const std::string& datatype, const NodeHandle& node_handle, const SubscriberCallbacksPtr& callbacks)
: impl_(std::make_shared<Impl>())
{
  impl_->topic_ = topic;
  impl_->md5sum_ = md5sum;
  impl_->datatype_ = datatype;
  impl_->node_handle_ = std::make_shared<NodeHandle>(node_handle);
  impl_->callbacks_ = callbacks;
}